

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void higan::Logger::SetLogToFile(string *log_dir,string *log_prefix,bool thread_safe)

{
  code *local_70;
  undefined8 local_68;
  _Bind<void_(higan::LogFile::*(std::shared_ptr<higan::LogFile>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_char_*,_unsigned_long)>
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  bool thread_safe_local;
  
  local_19 = thread_safe;
  std::make_shared<higan::LogFile,std::__cxx11::string_const&,std::__cxx11::string_const&,bool&>
            (&local_40,log_dir,(bool *)log_prefix);
  std::__shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  local_60._M_f = (offset_in_LogFile_to_subr)LogFile::Append;
  local_60._8_8_ = 0;
  std::__shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2> *)&local_60._M_bound_args,
             &g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>);
  std::function<void(char_const*,unsigned_long)>::
  function<std::_Bind<void(higan::LogFile::*(std::shared_ptr<higan::LogFile>,std::_Placeholder<1>,std::_Placeholder<2>))(char_const*,unsigned_long)>,void>
            ((function<void(char_const*,unsigned_long)> *)&local_40,&local_60);
  SetOutputFunction((OutputFunction *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_60._M_bound_args.
                     super__Tuple_impl<0UL,_std::shared_ptr<higan::LogFile>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                     .super__Head_base<0UL,_std::shared_ptr<higan::LogFile>,_false>._M_head_impl.
                     super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2> + 8));
  local_70 = LogFile::Flush;
  local_68 = 0;
  std::_Bind<void(higan::LogFile::*(std::shared_ptr<higan::LogFile>))()>::
  _Bind<std::shared_ptr<higan::LogFile>&>
            ((_Bind<void(higan::LogFile::*(std::shared_ptr<higan::LogFile>))()> *)&local_60,
             (offset_in_LogFile_to_subr *)&local_70,&g_log_file);
  std::function<void()>::
  function<std::_Bind<void(higan::LogFile::*(std::shared_ptr<higan::LogFile>))()>,void>
            ((function<void()> *)&local_40,
             (_Bind<void_(higan::LogFile::*(std::shared_ptr<higan::LogFile>))()> *)&local_60);
  SetFlushFunction((FlushFunction *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_60._M_bound_args.
                     super__Tuple_impl<0UL,_std::shared_ptr<higan::LogFile>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                     .super__Head_base<0UL,_std::shared_ptr<higan::LogFile>,_false>._M_head_impl.
                     super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2> + 8));
  return;
}

Assistant:

void Logger::SetLogToFile(const std::string& log_dir, const std::string& log_prefix, bool thread_safe)
{
	g_log_file = std::make_shared<LogFile>(log_dir, log_prefix, thread_safe);
	SetOutputFunction(std::bind(&LogFile::Append, g_log_file,
			std::placeholders::_1, std::placeholders::_2));
	SetFlushFunction(std::bind(&LogFile::Flush, g_log_file));
}